

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
interfaces::MakeSignalHandler(interfaces *this,connection connection)

{
  _func_int **pp_Var1;
  undefined8 *puVar2;
  element_type *peVar3;
  long in_FS_OFFSET;
  weak_count wStack_50;
  undefined8 local_48;
  weak_count wStack_40;
  long local_38;
  
  peVar3 = connection._weak_connection_body.px;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (undefined8 *)operator_new(0x18);
  pp_Var1 = peVar3->_vptr_connection_body_base;
  wStack_50.pi_ = (sp_counted_base *)(peVar3->_weak_blocker).px;
  peVar3->_vptr_connection_body_base = (_func_int **)0x0;
  (peVar3->_weak_blocker).px = (element_type *)0x0;
  local_48 = 0;
  peVar3->_vptr_connection_body_base = (_func_int **)0x0;
  wStack_40.pi_ = (sp_counted_base *)(peVar3->_weak_blocker).px;
  (peVar3->_weak_blocker).px = (element_type *)0x0;
  boost::detail::weak_count::~weak_count(&wStack_40);
  *puVar2 = &PTR__SignalHandler_00b3f540;
  puVar2[1] = pp_Var1;
  puVar2[2] = wStack_50.pi_;
  local_48 = 0;
  wStack_50.pi_ = (sp_counted_base *)0x0;
  wStack_40.pi_ = (sp_counted_base *)0x0;
  boost::detail::weak_count::~weak_count(&wStack_40);
  boost::detail::weak_count::~weak_count(&wStack_50);
  *(undefined8 **)this = puVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> MakeSignalHandler(boost::signals2::connection connection)
{
    return std::make_unique<common::SignalHandler>(std::move(connection));
}